

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

VoidPromiseAndPipeline * __thiscall
capnp::QueuedClient::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,QueuedClient *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  Promise<kj::Own<capnp::PipelineHook>_> *params;
  Promise<void> *pPVar1;
  Own<capnp::QueuedPipeline> *other;
  VoidPromiseAndPipeline *func;
  PropagateException local_f9;
  ForkedPromise<kj::Own<CallResultHolder>_> local_f8;
  undefined1 local_e8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:349:9),_kj::Own<CallResultHolder>_>
  completionPromise;
  Own<capnp::QueuedPipeline> pipeline;
  ForkedPromise<kj::Own<CallResultHolder>_> local_c0;
  undefined1 local_b0 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:342:9),_kj::Own<CallResultHolder>_>
  pipelinePromise;
  Own<capnp::CallContextHook> local_90;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:334:9),_kj::Own<capnp::CallContextHook>_>
  local_80;
  undefined1 local_60 [16];
  Promise<kj::Own<CallResultHolder>_> local_50;
  undefined1 local_40 [8];
  ForkedPromise<kj::Own<CallResultHolder>_> callResultPromise;
  Own<capnp::CallContextHook> *context_local;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  QueuedClient *this_local;
  
  func = __return_storage_ptr__;
  callResultPromise.hub.ptr = (ForkHub<kj::Own<CallResultHolder>_> *)context;
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkedPromise<kj::Own<capnp::ClientHook>_> *)local_60);
  local_90.disposer = (Disposer *)interfaceId;
  local_90.ptr._0_2_ = methodId;
  kj::
  mvCapture<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>&&)_1_,kj::Own<capnp::CallContextHook>&>
            (&local_80,(kj *)callResultPromise.hub.ptr,&local_90,(Type *)func);
  kj::Promise<kj::Own<capnp::ClientHook>>::
  then<kj::CaptureByMove<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
            ((Promise<kj::Own<capnp::ClientHook>> *)&local_50,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:334:9),_kj::Own<capnp::CallContextHook>_>
              *)local_60,(PropagateException *)&local_80);
  kj::Promise<kj::Own<CallResultHolder>_>::fork((Promise<kj::Own<CallResultHolder>_> *)local_40);
  kj::Promise<kj::Own<CallResultHolder>_>::~Promise(&local_50);
  kj::
  CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:334:9),_kj::Own<capnp::CallContextHook>_>
  ::~CaptureByMove(&local_80);
  kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
            ((Promise<kj::Own<capnp::ClientHook>_> *)local_60);
  kj::ForkedPromise<kj::Own<CallResultHolder>_>::addBranch(&local_c0);
  kj::
  Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
  ::
  then<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
              *)local_b0,(Type *)&local_c0,(PropagateException *)((long)&pipeline.ptr + 7));
  kj::Promise<kj::Own<CallResultHolder>_>::~Promise
            ((Promise<kj::Own<CallResultHolder>_> *)&local_c0);
  params = kj::mv<kj::Promise<kj::Own<capnp::PipelineHook>>>
                     ((Promise<kj::Own<capnp::PipelineHook>_> *)local_b0);
  kj::refcounted<capnp::QueuedPipeline,kj::Promise<kj::Own<capnp::PipelineHook>>>
            ((kj *)&completionPromise.super_PromiseBase.node.ptr,params);
  kj::ForkedPromise<kj::Own<CallResultHolder>_>::addBranch(&local_f8);
  kj::
  Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
  ::
  then<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>&&)_2_,kj::_::PropagateException>
            ((Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
              *)local_e8,(Type *)&local_f8,&local_f9);
  kj::Promise<kj::Own<CallResultHolder>_>::~Promise
            ((Promise<kj::Own<CallResultHolder>_> *)&local_f8);
  pPVar1 = kj::mv<kj::Promise<void>>((Promise<void> *)local_e8);
  kj::Promise<void>::Promise(&__return_storage_ptr__->promise,pPVar1);
  other = kj::mv<kj::Own<capnp::QueuedPipeline>>
                    ((Own<capnp::QueuedPipeline> *)&completionPromise.super_PromiseBase.node.ptr);
  kj::Own<capnp::PipelineHook>::Own<capnp::QueuedPipeline,void>
            (&__return_storage_ptr__->pipeline,other);
  kj::Promise<void>::~Promise((Promise<void> *)local_e8);
  kj::Own<capnp::QueuedPipeline>::~Own
            ((Own<capnp::QueuedPipeline> *)&completionPromise.super_PromiseBase.node.ptr);
  kj::Promise<kj::Own<capnp::PipelineHook>_>::~Promise
            ((Promise<kj::Own<capnp::PipelineHook>_> *)local_b0);
  kj::ForkedPromise<kj::Own<CallResultHolder>_>::~ForkedPromise
            ((ForkedPromise<kj::Own<CallResultHolder>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context) override {
    // This is a bit complicated.  We need to initiate this call later on.  When we initiate the
    // call, we'll get a void promise for its completion and a pipeline object.  Right now, we have
    // to produce a similar void promise and pipeline that will eventually be chained to those.
    // The problem is, these are two independent objects, but they both depend on the result of
    // one future call.
    //
    // So, we need to set up a continuation that will initiate the call later, then we need to
    // fork the promise for that continuation in order to send the completion promise and the
    // pipeline to their respective places.
    //
    // TODO(perf):  Too much reference counting?  Can we do better?  Maybe a way to fork
    //   Promise<Tuple<T, U>> into Tuple<Promise<T>, Promise<U>>?

    struct CallResultHolder: public kj::Refcounted {
      // Essentially acts as a refcounted \VoidPromiseAndPipeline, so that we can create a promise
      // for it and fork that promise.

      VoidPromiseAndPipeline content;
      // One branch of the fork will use content.promise, the other branch will use
      // content.pipeline.  Neither branch will touch the other's piece.

      inline CallResultHolder(VoidPromiseAndPipeline&& content): content(kj::mv(content)) {}

      kj::Own<CallResultHolder> addRef() { return kj::addRef(*this); }
    };

    // Create a promise for the call initiation.
    kj::ForkedPromise<kj::Own<CallResultHolder>> callResultPromise =
        promiseForCallForwarding.addBranch().then(kj::mvCapture(context,
        [=](kj::Own<CallContextHook>&& context, kj::Own<ClientHook>&& client){
          return kj::refcounted<CallResultHolder>(
              client->call(interfaceId, methodId, kj::mv(context)));
        })).fork();

    // Create a promise that extracts the pipeline from the call initiation, and construct our
    // QueuedPipeline to chain to it.
    auto pipelinePromise = callResultPromise.addBranch().then(
        [](kj::Own<CallResultHolder>&& callResult){
          return kj::mv(callResult->content.pipeline);
        });
    auto pipeline = kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise));

    // Create a promise that simply chains to the void promise produced by the call initiation.
    auto completionPromise = callResultPromise.addBranch().then(
        [](kj::Own<CallResultHolder>&& callResult){
          return kj::mv(callResult->content.promise);
        });

    // OK, now we can actually return our thing.
    return VoidPromiseAndPipeline { kj::mv(completionPromise), kj::mv(pipeline) };
  }